

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::DirectoryTreeSignatureTask::inputsAvailable
          (DirectoryTreeSignatureTask *this,TaskInterface ti)

{
  pointer pSVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  SubpathInfo *info;
  pointer pSVar3;
  hash_code local_c8;
  TaskInterface local_c0;
  BuildValue local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  local_c0.ctx = ti.ctx;
  local_c0.impl = ti.impl;
  local_c8 = llvm::hash_value<char>(&this->path);
  local_b0._0_8_ =
       llvm::hashing::detail::
       hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                 ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   )(this->directoryValue).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                  (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   )(this->directoryValue).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  local_c8 = llvm::hash_combine<llvm::hash_code,llvm::hash_code>(&local_c8,(hash_code *)&local_b0);
  pSVar1 = (this->childResults).
           super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (this->childResults).
                super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    local_b0._0_8_ =
         llvm::hashing::detail::
         hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                   ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     )(pSVar3->value).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                    (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     )(pSVar3->value).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    local_c8 = llvm::hash_combine<llvm::hash_code,llvm::hash_code>(&local_c8,(hash_code *)&local_b0)
    ;
    if ((pSVar3->directorySignatureValue).Storage.hasVal == true) {
      pvVar2 = llvm::Optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               getPointer(&pSVar3->directorySignatureValue);
      local_b0._0_8_ =
           llvm::hashing::detail::
           hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                     ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       )(pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start,
                      (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       )(pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish);
      local_c8 = llvm::hash_combine<llvm::hash_code,llvm::hash_code>
                           (&local_c8,(hash_code *)&local_b0);
    }
    else {
      local_b0.kind = 0x3e98722e;
      local_b0.numOutputInfos = 0xc183979c;
      local_c8 = llvm::hash_combine<llvm::hash_code,unsigned_long>
                           (&local_c8,(unsigned_long *)&local_b0);
    }
  }
  local_b0.kind = DirectoryTreeSignature;
  local_b0.numOutputInfos = 0;
  local_b0.valueData.asOutputInfo.device = 0;
  local_b0.valueData.asOutputInfo.inode = 0;
  local_b0.valueData.asOutputInfo.mode = 0;
  local_b0.valueData.asOutputInfo.size = 0;
  local_b0.valueData.asOutputInfo.modTime.seconds = 0;
  local_b0.valueData.asOutputInfo.modTime.nanoseconds = 0;
  local_b0.valueData._48_8_ = 0;
  local_b0.valueData._56_8_ = 0;
  local_b0.valueData._64_8_ = 0;
  local_b0.valueData._72_8_ = 0;
  local_b0.stringValues.contents = (char *)0x0;
  local_b0.stringValues.size = 0;
  local_b0.signature.value = local_c8.value;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_40,&local_b0);
  llbuild::core::TaskInterface::complete(&local_c0,(ValueType *)&local_40,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_b0);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // Compute the signature across all of the inputs.
    using llvm::hash_combine;
    llvm::hash_code code = hash_value(path);

    // Add the signature for the actual input path.
    code = hash_combine(
        code, hash_combine_range(directoryValue.begin(), directoryValue.end()));

    // For now, we represent this task as the aggregation of all the inputs.
    for (const auto& info: childResults) {
      // We merge the children by simply combining their encoded representation.
      code = hash_combine(
          code, hash_combine_range(info.value.begin(), info.value.end()));
      if (info.directorySignatureValue.hasValue()) {
        auto& data = info.directorySignatureValue.getValue();
        code = hash_combine(
            code, hash_combine_range(data.begin(), data.end()));
      } else {
        // Combine a random number to represent nil.
        code = hash_combine(code, 0XC183979C3E98722E);
      }
    }

    // Compute the signature.
    ti.complete(BuildValue::makeDirectoryTreeSignature(
                  CommandSignature(uint64_t(code))).toData());
  }